

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

void Cec_GiaSplitExplore(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  long lVar11;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSplit.c"
                  ,0x96,"void Cec_GiaSplitExplore(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  if (0 < p->nObjs) {
    lVar7 = 0;
    lVar11 = 0;
    uVar9 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar10 = (Gia_Obj_t *)(&pGVar1->field_0x0 + lVar7);
      if (((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) &&
         (iVar3 = Gia_ObjRecognizeExor(pGVar10,&local_38,&local_40), iVar3 != 0)) {
        uVar8 = (uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar7) & 0x1fffffff;
        pGVar5 = (Gia_Obj_t *)(lVar7 + (ulong)(uVar8 * 4) * -3 + (long)pGVar1);
        pGVar2 = p->pObjs;
        if ((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) goto LAB_005d2c46;
        if (1 < p->pRefs[(int)((long)pGVar1 + ((lVar7 + (ulong)(uVar8 << 2) * -3) - (long)pGVar2) >>
                              2) * -0x55555555]) {
          uVar8 = (uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar7) >> 0x20) & 0x1fffffff;
          pGVar5 = (Gia_Obj_t *)(lVar7 + (ulong)(uVar8 * 4) * -3 + (long)pGVar1);
          if ((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) goto LAB_005d2c46;
          if (1 < p->pRefs[(int)((long)pGVar1 + ((lVar7 + (ulong)(uVar8 << 2) * -3) - (long)pGVar2)
                                >> 2) * -0x55555555]) goto LAB_005d2c23;
        }
        printf("%5d : ",uVar9);
        pGVar5 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
        pGVar2 = p->pObjs;
        if ((((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) ||
            (pGVar6 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe), pGVar6 < pGVar2)) ||
           (pGVar2 + p->nObjs <= pGVar6)) {
LAB_005d2c46:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        printf("%2d %2d    ",
               (ulong)(uint)p->pRefs[(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555]
               ,(ulong)(uint)p->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555
                                     ]);
        uVar8 = (uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar7) & 0x1fffffff;
        pGVar10 = (Gia_Obj_t *)((long)pGVar10 + (ulong)(uVar8 * 4) * -3);
        pGVar2 = p->pObjs;
        if ((pGVar10 < pGVar2) || (pGVar2 + p->nObjs <= pGVar10)) goto LAB_005d2c46;
        uVar4 = (uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar7) >> 0x20) & 0x1fffffff;
        pGVar10 = (Gia_Obj_t *)((long)pGVar1 + lVar7 + (ulong)(uVar4 * 4) * -3);
        if ((pGVar10 < pGVar2) || (pGVar2 + p->nObjs <= pGVar10)) goto LAB_005d2c46;
        uVar9 = (ulong)((int)uVar9 + 1);
        printf("%2d %2d  \n",
               (ulong)(uint)p->pRefs[(int)((long)pGVar1 +
                                           lVar7 + ((ulong)(uVar8 << 2) * -3 - (long)pGVar2) >> 2) *
                                     -0x55555555],
               (ulong)(uint)p->pRefs[(int)((long)pGVar1 +
                                           lVar7 + ((ulong)(uVar4 << 2) * -3 - (long)pGVar2) >> 2) *
                                     -0x55555555]);
      }
LAB_005d2c23:
      lVar11 = lVar11 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  return;
}

Assistant:

void Cec_GiaSplitExplore( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFan0, * pFan1;
    int i, Counter = 0;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            continue;
        if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) > 1 && 
             Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > 1 )
             continue;
        printf( "%5d : ", Counter++ );
        printf( "%2d %2d    ", Gia_ObjRefNum(p, Gia_Regular(pFan0)),  Gia_ObjRefNum(p, Gia_Regular(pFan1)) );
        printf( "%2d %2d  \n", Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)), Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) );
    }
}